

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_BRAND_WEAPON(effect_handler_context_t_conflict *context)

{
  uint32_t uVar1;
  object *obj;
  char *name;
  
  obj = equipped_item_by_slot_name(player,"weapon");
  uVar1 = Rand_div(2);
  name = "Frost";
  if (uVar1 == 0) {
    name = "Flame";
  }
  brand_object(obj,name);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_BRAND_WEAPON(effect_handler_context_t *context)
{
	struct object *obj = equipped_item_by_slot_name(player, "weapon");

	/* Select the brand */
	const char *brand = one_in_(2) ? "Flame" : "Frost";

	/* Brand the weapon */
	brand_object(obj, brand);

	context->ident = true;
	return true;
}